

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O1

Expression __thiscall
cnn::FastLSTMBuilder::add_input_impl(FastLSTMBuilder *this,int prev,Expression *x)

{
  byte bVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long *in_RCX;
  long *plVar4;
  long *plVar5;
  long lVar6;
  undefined4 in_register_00000034;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  bool bVar10;
  double dVar11;
  Expression EVar12;
  Expression i_aot;
  Expression i_ot;
  Expression i_awt;
  Expression i_it;
  Expression ph_t;
  Expression i_wt;
  Expression i_ait;
  Expression i_ft;
  long local_1b0;
  undefined1 local_1a8 [8];
  ulong local_1a0;
  undefined1 local_198 [16];
  pointer local_188;
  undefined4 local_180;
  iterator local_178;
  undefined4 local_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_158;
  undefined4 local_150;
  uint local_148;
  undefined4 local_144;
  undefined8 local_140;
  ulong local_138;
  long local_130;
  undefined1 local_128 [8];
  ulong local_120;
  Expression local_118;
  long local_108;
  iterator local_100;
  Expression local_f8;
  Expression local_e8;
  Expression local_d8;
  Expression local_c8;
  long local_b8;
  long local_b0;
  ulong local_a8;
  initializer_list<cnn::expr::Expression> local_a0;
  FastLSTMBuilder *local_90;
  long *local_88;
  long *local_80;
  long local_78;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_70;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_68;
  initializer_list<cnn::expr::Expression> local_60;
  initializer_list<cnn::expr::Expression> local_50;
  Expression local_40;
  
  lVar7 = CONCAT44(in_register_00000034,prev);
  local_148 = (uint)x;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_198,
             (ulong)*(uint *)(lVar7 + 0xc0),(allocator_type *)&local_e8);
  local_68 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar7 + 0x58);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_68,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      local_198);
  if ((ComputationGraph *)local_198._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_198._0_8_);
  }
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_198,
             (ulong)*(uint *)(lVar7 + 0xc0),(allocator_type *)&local_e8);
  local_70 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar7 + 0x70);
  local_90 = this;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_70,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      local_198);
  if ((ComputationGraph *)local_198._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_198._0_8_);
  }
  local_b0 = *(long *)(lVar7 + 0x60);
  if (*(int *)(lVar7 + 0xc0) != 0) {
    local_130 = *(long *)(lVar7 + 0x78);
    local_80 = (long *)(lVar7 + 0x90);
    local_88 = (long *)(lVar7 + 0xa8);
    local_1b0 = 0;
    local_78 = (ulong)local_148 << 3;
    lVar8 = 0;
    local_a8 = 0;
    local_178 = (iterator)*in_RCX;
    uVar9 = (int)in_RCX[1];
    local_b8 = lVar7;
    do {
      lVar6 = *(long *)(lVar7 + 0x40);
      local_e8.pg = (ComputationGraph *)0x0;
      local_e8.i.t = 0;
      bVar1 = *(byte *)(lVar7 + 0x88);
      bVar10 = (int)local_148 < 0;
      if (bVar10) {
        plVar4 = local_88;
        plVar5 = local_80;
        if ((bVar1 & 1) != 0) goto LAB_0016faae;
        local_138 = 0;
        local_140 = 0;
      }
      else {
        plVar4 = (long *)(local_78 * 3 + *(long *)local_70);
        plVar5 = (long *)(*(long *)local_68 + local_78 * 3);
LAB_0016faae:
        local_140 = *(undefined8 *)(*plVar5 + lVar8);
        local_138 = (ulong)*(uint *)(*plVar5 + 8 + lVar8);
        local_e8.pg = *(ComputationGraph **)(*plVar4 + lVar8);
        local_e8.i.t = *(uint *)(*plVar4 + 8 + lVar8);
      }
      local_c8.pg = (ComputationGraph *)0x0;
      local_c8.i.t = 0;
      local_170 = uVar9;
      local_108 = lVar6;
      local_100 = local_178;
      if (bVar10 && (bVar1 & 1) == 0) {
        puVar2 = *(undefined8 **)(lVar6 + local_1b0);
        local_198._0_8_ = puVar2[6];
        local_198._8_4_ = *(undefined4 *)(puVar2 + 7);
        local_188 = (pointer)*puVar2;
        local_180 = *(undefined4 *)(puVar2 + 1);
        local_60._M_array = (iterator)local_198;
        local_60._M_len = 3;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_118,&local_60);
      }
      else {
        puVar2 = *(undefined8 **)(lVar6 + local_1b0);
        local_198._0_8_ = puVar2[6];
        local_198._8_4_ = *(undefined4 *)(puVar2 + 7);
        local_188 = (pointer)*puVar2;
        local_180 = *(undefined4 *)(puVar2 + 1);
        local_168 = puVar2[2];
        local_160 = *(undefined4 *)(puVar2 + 3);
        local_158 = local_140;
        local_150 = (undefined4)local_138;
        local_128 = (undefined1  [8])local_198;
        local_120 = 5;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_60,(initializer_list<cnn::expr::Expression> *)local_128);
        expr::cwise_multiply
                  ((expr *)&local_d8,(Expression *)(*(long *)(lVar6 + local_1b0) + 0x20),&local_e8);
        lVar6 = local_108;
        expr::operator+((expr *)&local_118,(Expression *)&local_60,&local_d8);
      }
      local_c8.pg = local_118.pg;
      local_c8.i.t = local_118.i.t;
      expr::logistic((expr *)&local_118,&local_c8);
      dVar11 = SUB648(ZEXT464(0x3f800000),0);
      expr::operator-((expr *)&local_60,1.0,&local_118);
      local_128 = (undefined1  [8])0x0;
      local_120 = local_120 & 0xffffffff00000000;
      if (bVar10 && (bVar1 & 1) == 0) {
        lVar7 = *(long *)(lVar6 + local_1b0);
        local_198._0_8_ = *(undefined8 *)(lVar7 + 0xa0);
        local_198._8_4_ = *(uint *)(lVar7 + 0xa8);
        local_188 = *(pointer *)(lVar7 + 0x80);
        local_180 = *(undefined4 *)(lVar7 + 0x88);
        local_1a0 = 3;
      }
      else {
        lVar7 = *(long *)(lVar6 + local_1b0);
        local_198._0_8_ = *(undefined8 *)(lVar7 + 0xa0);
        local_198._8_4_ = *(uint *)(lVar7 + 0xa8);
        local_188 = *(pointer *)(lVar7 + 0x80);
        local_180 = *(undefined4 *)(lVar7 + 0x88);
        local_168 = *(undefined8 *)(lVar7 + 0x90);
        local_160 = *(undefined4 *)(lVar7 + 0x98);
        local_158 = local_140;
        local_150 = (undefined4)local_138;
        local_1a0 = 5;
      }
      local_1a8 = (undefined1  [8])local_198;
      local_178 = local_100;
      local_170 = uVar9;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_d8,(initializer_list<cnn::expr::Expression> *)local_1a8);
      local_128 = (undefined1  [8])local_d8.pg;
      local_120 = CONCAT44(local_120._4_4_,local_d8.i.t);
      local_144 = uVar9;
      dVar11 = expr::tanh((expr *)&local_d8,dVar11);
      if (bVar10 && (bVar1 & 1) == 0) {
        expr::cwise_multiply((expr *)local_198,&local_118,&local_d8);
        lVar7 = *(long *)(local_130 + -0x18);
        *(undefined8 *)(lVar7 + lVar8) = local_198._0_8_;
        *(undefined4 *)(lVar7 + 8 + lVar8) = local_198._8_4_;
      }
      else {
        expr::cwise_multiply((expr *)local_198,&local_118,&local_d8);
        expr::cwise_multiply((expr *)local_1a8,(Expression *)&local_60,&local_e8);
        expr::operator+((expr *)&local_f8,(Expression *)local_1a8,(Expression *)local_198);
        lVar7 = *(long *)(local_130 + -0x18);
        *(ComputationGraph **)(lVar7 + lVar8) = local_f8.pg;
        *(uint *)(lVar7 + 8 + lVar8) = local_f8.i.t;
      }
      lVar7 = local_108;
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = local_1a0 & 0xffffffff00000000;
      if (bVar10 && (bVar1 & 1) == 0) {
        lVar7 = *(long *)(local_108 + local_1b0);
        local_198._0_8_ = *(undefined8 *)(lVar7 + 0x70);
        local_198._8_4_ = *(uint *)(lVar7 + 0x78);
        local_188 = *(pointer *)(lVar7 + 0x40);
        local_180 = *(undefined4 *)(lVar7 + 0x48);
        local_178 = local_100;
        local_170 = local_144;
        local_a0._M_array = (iterator)local_198;
        local_a0._M_len = 3;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_f8,&local_a0);
      }
      else {
        lVar6 = *(long *)(local_108 + local_1b0);
        local_198._0_8_ = *(undefined8 *)(lVar6 + 0x70);
        local_198._8_4_ = *(uint *)(lVar6 + 0x78);
        local_188 = *(pointer *)(lVar6 + 0x40);
        local_180 = *(undefined4 *)(lVar6 + 0x48);
        local_178 = local_100;
        local_170 = local_144;
        local_168 = *(undefined8 *)(lVar6 + 0x50);
        local_160 = *(undefined4 *)(lVar6 + 0x58);
        local_158 = local_140;
        local_150 = (undefined4)local_138;
        local_50._M_array = (iterator)local_198;
        local_50._M_len = 5;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_a0,&local_50);
        expr::cwise_multiply
                  ((expr *)&local_40,(Expression *)(*(long *)(lVar7 + local_1b0) + 0x60),
                   (Expression *)(*(long *)(local_130 + -0x18) + lVar8));
        expr::operator+((expr *)&local_f8,(Expression *)&local_a0,&local_40);
      }
      uVar3 = local_a8;
      lVar7 = local_b8;
      local_1a8 = (undefined1  [8])local_f8.pg;
      local_1a0 = CONCAT44(local_1a0._4_4_,local_f8.i.t);
      expr::logistic((expr *)local_198,(Expression *)local_1a8);
      expr::tanh((expr *)&local_f8,dVar11);
      expr::cwise_multiply((expr *)&local_a0,(Expression *)local_198,&local_f8);
      lVar6 = *(long *)(local_b0 + -0x18);
      *(iterator *)(lVar6 + lVar8) = local_a0._M_array;
      *(undefined4 *)(lVar6 + 8 + lVar8) = (undefined4)local_a0._M_len;
      local_a8 = uVar3 + 1;
      lVar8 = lVar8 + 0x10;
      local_1b0 = local_1b0 + 0x18;
      local_178 = local_a0._M_array;
      uVar9 = (undefined4)local_a0._M_len;
    } while (local_a8 < *(uint *)(lVar7 + 0xc0));
  }
  lVar7 = *(long *)(local_b0 + -0x10);
  (local_90->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar7 + -0x10);
  (local_90->super_RNNBuilder).cur.t = *(int *)(lVar7 + -8);
  EVar12._8_8_ = lVar7;
  EVar12.pg = (ComputationGraph *)local_90;
  return EVar12;
}

Assistant:

Expression FastLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state) {
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + cwise_multiply(vars[C2I], i_c_tm1);
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1}) +
              cwise_multiply(vars[C2I], i_c_tm1);
    } else {
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    }
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state) {
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + cwise_multiply(vars[C2O], ct[i]);
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1}) +
              cwise_multiply(vars[C2O], ct[i]);
    }
    else {
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    }
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
  }
  return ht.back();
}